

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_loop_filter_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 local_6c;
  RK_U32 local_68;
  RK_S32 value_10;
  RK_U32 value_9;
  RK_S32 value_8;
  RK_U32 value_7;
  RK_U32 value_6;
  RK_S8 *ref_loop_filter_mode_deltas;
  RK_S8 *ref_loop_filter_ref_deltas;
  RK_U32 value_5;
  RK_U32 value_4;
  RK_U32 value_3;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  RK_S32 i;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  if ((ctx->coded_lossless == 0) && (current->allow_intrabc == '\0')) {
    _err = current;
    current_local = (AV1RawFrameHeader *)gb;
    gb_local = &ctx->gb;
    value_1 = mpp_av1_read_unsigned(gb,6,"loop_filter_level[0]",&value_2,0,0x3f);
    ctx_local._4_4_ = value_1;
    if (-1 < (int)value_1) {
      _err->loop_filter_level[0] = (RK_U8)value_2;
      value_1 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,6,"loop_filter_level[1]",&value_3,0,0x3f);
      ctx_local._4_4_ = value_1;
      if (-1 < (int)value_1) {
        _err->loop_filter_level[1] = (RK_U8)value_3;
        if ((1 < *(int *)&gb_local[0x50].buf) &&
           ((_err->loop_filter_level[0] != '\0' || (_err->loop_filter_level[1] != '\0')))) {
          value_1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,6,"loop_filter_level[2]",&value_4,0,
                               0x3f);
          if ((int)value_1 < 0) {
            return value_1;
          }
          _err->loop_filter_level[2] = (RK_U8)value_4;
          value_1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,6,"loop_filter_level[3]",&value_5,0,
                               0x3f);
          if ((int)value_1 < 0) {
            return value_1;
          }
          _err->loop_filter_level[3] = (RK_U8)value_5;
        }
        if ((av1d_debug & 2) != 0) {
          _mpp_log_l(4,"av1d_cbs","orderhint %d loop_filter_level %d %d %d %d\n",
                     "mpp_av1_loop_filter_params",(ulong)_err->order_hint,
                     (ulong)_err->loop_filter_level[0],(uint)_err->loop_filter_level[1],
                     (uint)_err->loop_filter_level[2],(uint)_err->loop_filter_level[3]);
        }
        value_1 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,3,"loop_filter_sharpness",
                             (RK_U32 *)((long)&ref_loop_filter_ref_deltas + 4),0,7);
        ctx_local._4_4_ = value_1;
        if (-1 < (int)value_1) {
          _err->loop_filter_sharpness = ref_loop_filter_ref_deltas._4_1_;
          value_1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,1,"loop_filter_delta_enabled",
                               (RK_U32 *)&ref_loop_filter_ref_deltas,0,1);
          ctx_local._4_4_ = value_1;
          if (-1 < (int)value_1) {
            _err->loop_filter_delta_enabled = (RK_U8)ref_loop_filter_ref_deltas;
            if (_err->loop_filter_delta_enabled == '\0') {
              for (value = 0; (int)value < 8; value = value + 1) {
                _err->loop_filter_ref_deltas[(int)value] = "\x01"[(int)value];
              }
              for (value = 0; (int)value < 2; value = value + 1) {
                _err->loop_filter_mode_deltas[(int)value] = ""[(int)value];
              }
            }
            else {
              if (_err->primary_ref_frame == '\a') {
                ref_loop_filter_mode_deltas = "\x01";
                _value_7 = "";
              }
              else {
                ref_loop_filter_mode_deltas =
                     (RK_S8 *)((long)gb_local +
                              (long)_err->ref_frame_idx[_err->primary_ref_frame] * 0xfc + 0x1d3f4);
                _value_7 = (RK_S8 *)((long)gb_local +
                                    (long)_err->ref_frame_idx[_err->primary_ref_frame] * 0xfc +
                                    0x1d3fc);
              }
              value_1 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)current_local,1,"loop_filter_delta_update",
                                   (RK_U32 *)&value_8,0,1);
              if ((int)value_1 < 0) {
                return value_1;
              }
              _err->loop_filter_delta_update = (RK_U8)value_8;
              for (value = 0; (int)value < 8; value = value + 1) {
                if (_err->loop_filter_delta_update == '\0') {
                  _err->update_ref_delta[(int)value] = '\0';
                }
                else {
                  value_1 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)current_local,1,"update_ref_delta[i]",
                                       &value_9,0,1);
                  if ((int)value_1 < 0) {
                    return value_1;
                  }
                  _err->update_ref_delta[(int)value] = (RK_U8)value_9;
                }
                if (_err->update_ref_delta[(int)value] == '\0') {
                  _err->loop_filter_ref_deltas[(int)value] = ref_loop_filter_mode_deltas[(int)value]
                  ;
                }
                else {
                  value_1 = mpp_av1_read_signed((BitReadCtx_t *)current_local,7,
                                                "loop_filter_ref_deltas[i]",&value_10,-0x40,0x3f);
                  if ((int)value_1 < 0) {
                    return value_1;
                  }
                  _err->loop_filter_ref_deltas[(int)value] = (RK_S8)value_10;
                }
              }
              for (value = 0; (int)value < 2; value = value + 1) {
                if (_err->loop_filter_delta_update == '\0') {
                  _err->update_mode_delta[(int)value] = '\0';
                }
                else {
                  value_1 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)current_local,1,"update_mode_delta[i]",
                                       &local_68,0,1);
                  if ((int)value_1 < 0) {
                    return value_1;
                  }
                  _err->update_mode_delta[(int)value] = (RK_U8)local_68;
                }
                if (_err->update_mode_delta[(int)value] == '\0') {
                  _err->loop_filter_mode_deltas[(int)value] = _value_7[(int)value];
                }
                else {
                  value_1 = mpp_av1_read_signed((BitReadCtx_t *)current_local,7,
                                                "loop_filter_mode_deltas[i]",&local_6c,-0x40,0x3f);
                  if ((int)value_1 < 0) {
                    return value_1;
                  }
                  _err->loop_filter_mode_deltas[(int)value] = (RK_S8)local_6c;
                }
              }
            }
            ctx_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    current->loop_filter_level[0] = '\0';
    current->loop_filter_level[1] = '\0';
    current->loop_filter_ref_deltas[0] = '\x01';
    current->loop_filter_ref_deltas[1] = '\0';
    current->loop_filter_ref_deltas[2] = '\0';
    current->loop_filter_ref_deltas[3] = '\0';
    current->loop_filter_ref_deltas[5] = '\0';
    current->loop_filter_ref_deltas[4] = -1;
    current->loop_filter_ref_deltas[7] = -1;
    current->loop_filter_ref_deltas[6] = -1;
    for (value = 0; (int)value < 2; value = value + 1) {
      current->loop_filter_mode_deltas[(int)value] = '\0';
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32 mpp_av1_loop_filter_params(AV1Context *ctx, BitReadCtx_t *gb,
                                         AV1RawFrameHeader *current)
{
    static const RK_S8 default_loop_filter_ref_deltas[AV1_TOTAL_REFS_PER_FRAME] =
    { 1, 0, 0, 0, -1, 0, -1, -1 };
    static const RK_S8 default_loop_filter_mode_deltas[2] = { 0, 0 };
    RK_S32 i, err;

    if (ctx->coded_lossless || current->allow_intrabc) {
        infer(loop_filter_level[0], 0);
        infer(loop_filter_level[1], 0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_INTRA],    1);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_LAST],     0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_LAST2],    0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_LAST3],    0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_BWDREF],   0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_GOLDEN],  -1);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_ALTREF],  -1);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_ALTREF2], -1);
        for (i = 0; i < 2; i++)
            infer(loop_filter_mode_deltas[i], 0);
        return 0;
    }

    fb(6, loop_filter_level[0]);
    fb(6, loop_filter_level[1]);

    if (ctx->num_planes > 1) {
        if (current->loop_filter_level[0] ||
            current->loop_filter_level[1]) {
            fb(6, loop_filter_level[2]);
            fb(6, loop_filter_level[3]);
        }
    }

    av1d_dbg(AV1D_DBG_HEADER, "orderhint %d loop_filter_level %d %d %d %d\n",
             current->order_hint,
             current->loop_filter_level[0], current->loop_filter_level[1],
             current->loop_filter_level[2], current->loop_filter_level[3]);
    fb(3, loop_filter_sharpness);

    flag(loop_filter_delta_enabled);
    if (current->loop_filter_delta_enabled) {
        const RK_S8 *ref_loop_filter_ref_deltas, *ref_loop_filter_mode_deltas;

        if (current->primary_ref_frame == AV1_PRIMARY_REF_NONE) {
            ref_loop_filter_ref_deltas = default_loop_filter_ref_deltas;
            ref_loop_filter_mode_deltas = default_loop_filter_mode_deltas;
        } else {
            ref_loop_filter_ref_deltas =
                ctx->ref_s[current->ref_frame_idx[current->primary_ref_frame]].loop_filter_ref_deltas;
            ref_loop_filter_mode_deltas =
                ctx->ref_s[current->ref_frame_idx[current->primary_ref_frame]].loop_filter_mode_deltas;
        }

        flag(loop_filter_delta_update);
        for (i = 0; i < AV1_TOTAL_REFS_PER_FRAME; i++) {
            if (current->loop_filter_delta_update)
                flags(update_ref_delta[i], 1, i);
            else
                infer(update_ref_delta[i], 0);
            if (current->update_ref_delta[i])
                sus(1 + 6, loop_filter_ref_deltas[i], 1, i);
            else
                infer(loop_filter_ref_deltas[i], ref_loop_filter_ref_deltas[i]);
        }
        for (i = 0; i < 2; i++) {
            if (current->loop_filter_delta_update)
                flags(update_mode_delta[i], 1, i);
            else
                infer(update_mode_delta[i], 0);
            if (current->update_mode_delta[i])
                sus(1 + 6, loop_filter_mode_deltas[i], 1, i);
            else
                infer(loop_filter_mode_deltas[i], ref_loop_filter_mode_deltas[i]);
        }
    } else {
        for (i = 0; i < AV1_TOTAL_REFS_PER_FRAME; i++)
            infer(loop_filter_ref_deltas[i], default_loop_filter_ref_deltas[i]);
        for (i = 0; i < 2; i++)
            infer(loop_filter_mode_deltas[i], default_loop_filter_mode_deltas[i]);
    }

    return 0;
}